

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  pIVar1 = GImGui;
  lVar3 = (long)(this->IDStack).Size;
  if (0 < lVar3) {
    fVar4 = (this->Pos).x;
    fVar5 = (this->Pos).y;
    local_18 = (int)((r_abs->Min).x - fVar4);
    iStack_14 = (int)((r_abs->Min).y - fVar5);
    iStack_10 = (int)((r_abs->Max).x - fVar4);
    iStack_c = (int)((r_abs->Max).y - fVar5);
    uVar2 = ~(this->IDStack).Data[lVar3 + -1];
    lVar3 = 0;
    do {
      uVar2 = uVar2 >> 8 ^
              GCrc32LookupTable[(uint)*(byte *)((long)&local_18 + lVar3) ^ uVar2 & 0xff];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    uVar2 = ~uVar2;
    if (GImGui->ActiveId == uVar2) {
      GImGui->ActiveIdIsAlive = uVar2;
    }
    if (pIVar1->ActiveIdPreviousFrame == uVar2) {
      pIVar1->ActiveIdPreviousFrameIsAlive = true;
    }
    return uVar2;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                ,0x50d,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}